

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O0

error_code __thiscall pstore::exchange::import_ns::compilation::key(compilation *this,string *k)

{
  bool bVar1;
  error_code eVar2;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  local_60;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> local_50;
  reference local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *k_local;
  compilation *this_local;
  error_category *local_10;
  
  local_28 = k;
  k_local = (string *)this;
  bVar1 = std::operator==(k,"triple");
  if (bVar1) {
    std::bitset<2UL>::operator[]((bitset<2UL> *)&local_38,(size_t)&this->seen_);
    std::bitset<2UL>::reference::operator=(&local_38,true);
    std::bitset<2UL>::reference::~reference(&local_38);
    eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                      (&this->super_rule,&this->triple_);
    local_10 = eVar2._M_cat;
    this_local._0_4_ = eVar2._M_value;
  }
  else {
    bVar1 = std::operator==(local_28,"definitions");
    if (bVar1) {
      std::bitset<2UL>::operator[]((bitset<2UL> *)&local_48,(size_t)&this->seen_);
      std::bitset<2UL>::reference::operator=(&local_48,true);
      std::bitset<2UL>::reference::~reference(&local_48);
      local_50.ptr_ = (this->names_).ptr_;
      std::
      shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::shared_ptr(&local_60,&this->fragments_);
      eVar2 = push_array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                        (&this->super_rule,&this->definitions_,local_50,&local_60);
      local_10 = eVar2._M_cat;
      this_local._0_4_ = eVar2._M_value;
      std::
      shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::~shared_ptr(&local_60);
    }
    else {
      std::error_code::error_code<pstore::exchange::import_ns::error,void>
                ((error_code *)&this_local,unknown_compilation_object_key);
    }
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code compilation::key (std::string const & k) {
                if (k == "triple") {
                    seen_[triple_index] = true;
                    return push<uint64_rule> (&triple_);
                }
                if (k == "definitions") {
                    seen_[definitions_index] = true;
                    return push_array_rule<definition_object> (this, &definitions_, names_,
                                                               fragments_);
                }
                return error::unknown_compilation_object_key;
            }